

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# black_leaf_node.h
# Opt level: O3

void __thiscall compose::BlackLeafNode::BlackLeafNode(BlackLeafNode *this,string *name)

{
  (this->super_LeafNode).super_INode.name_._M_dataplus._M_p =
       (pointer)&(this->super_LeafNode).super_INode.name_.field_2;
  (this->super_LeafNode).super_INode.name_._M_string_length = 0;
  (this->super_LeafNode).super_INode.name_.field_2._M_local_buf[0] = '\0';
  (this->super_LeafNode).super_INode._vptr_INode = (_func_int **)&PTR_AddNode_00129858;
  std::__cxx11::string::_M_assign((string *)&(this->super_LeafNode).super_INode.name_);
  return;
}

Assistant:

BlackLeafNode::BlackLeafNode(const std::string& name) {
    name_ = name;
}